

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSpectralTransform.cpp
# Opt level: O2

int __thiscall TPZSTShiftAndInvert<double>::ClassId(TPZSTShiftAndInvert<double> *this)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"TPZSTShiftAndInvert",&local_39);
  uVar1 = Hash(&local_38);
  iVar2 = TPZSTShiftOrigin<double>::ClassId(&this->super_TPZSTShiftOrigin<double>);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int
TPZSTShiftAndInvert<TVar>::ClassId() const
{
  return Hash("TPZSTShiftAndInvert") ^
    TPZSTShiftOrigin<TVar>::ClassId() << 1;
}